

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

void * NMEADeviceThread(void *pParam)

{
  int iVar1;
  int iVar2;
  long lVar3;
  CRITICAL_SECTION *__mutex;
  NMEADATA *__dest;
  NMEADATA nmeadata;
  NMEADATA NStack_408;
  
  __mutex = NMEADeviceCS;
  __dest = nmeadataNMEADevice;
  lVar3 = 0;
  do {
    if (*(void **)((long)addrsNMEADevice + lVar3 * 2) == pParam) {
      iVar2 = 0;
      memset(&NStack_408,0,0x3d8);
      do {
        mSleep((long)*(int *)((long)pParam + 0x900));
        memset(&NStack_408,0,0x3d8);
        iVar1 = GetLatestDataNMEADevice((NMEADEVICE *)pParam,&NStack_408);
        if (iVar1 != 0) {
          iVar2 = iVar1;
        }
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        memcpy(__dest,&NStack_408,0x3d8);
        *(int *)((long)resNMEADevice + lVar3) = iVar2;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      } while (*(int *)((long)bExitNMEADevice + lVar3) == 0);
      return (void *)0x0;
    }
    __mutex = __mutex + 1;
    __dest = __dest + 1;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x40);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE NMEADeviceThread(void* pParam)
{
	NMEADEVICE* pNMEADevice = (NMEADEVICE*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	NMEADATA nmeadata;

	while (addrsNMEADevice[id] != pNMEADevice)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	memset(&nmeadata, 0, sizeof(NMEADATA));
	for (;;)
	{
		mSleep(pNMEADevice->threadperiod);
		memset(&nmeadata, 0, sizeof(NMEADATA));
		res = GetLatestDataNMEADevice(pNMEADevice, &nmeadata);
		if (res != EXIT_SUCCESS) err = res;
		EnterCriticalSection(&NMEADeviceCS[id]);
		nmeadataNMEADevice[id] = nmeadata;
		resNMEADevice[id] = err;
		LeaveCriticalSection(&NMEADeviceCS[id]);
		if (bExitNMEADevice[id]) break;
	}

	return 0;
}